

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorUtils.cpp
# Opt level: O0

void __thiscall HFactor::reportAsm(HFactor *this)

{
  double dVar1;
  value_type vVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  reference pvVar6;
  uint *puVar7;
  reference pvVar8;
  char *pcVar9;
  long in_RDI;
  vector<int,_std::allocator<int>_> *this_00;
  double extraout_XMM0_Qa;
  double merit_local;
  HighsInt row_count;
  double value;
  HighsInt i;
  HighsInt k;
  HighsInt end;
  HighsInt start;
  double min_pivot;
  HighsInt j;
  HighsInt count;
  uint local_24;
  uint local_10;
  uint local_c;
  
  for (local_c = 1; (int)local_c <= *(int *)(in_RDI + 200); local_c = local_c + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3d8),(long)(int)local_c);
    if (-1 < *pvVar6) {
      puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3d8),
                                  (long)(int)local_c);
      local_10 = *puVar7;
      while (local_10 != 0xffffffff) {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x300),
                            (long)(int)local_10);
        dVar1 = *pvVar8;
        puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),
                                    (long)(int)local_10);
        local_24 = *puVar7;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x288),
                            (long)(int)local_10);
        uVar5 = local_24 + *pvVar6;
        printf("Col %4d: count = %2d; min_pivot = %10.4g; [%4d, %4d)\n",dVar1,(ulong)local_10,
               (ulong)local_c,(ulong)local_24,(ulong)uVar5);
        for (; (int)local_24 < (int)uVar5; local_24 = local_24 + 1) {
          puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),
                                      (long)(int)local_24);
          uVar3 = *puVar7;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2e8),
                              (long)(int)local_24);
          vVar2 = *pvVar8;
          this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x330);
          puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     (this_00,(long)(int)uVar3);
          uVar4 = *puVar7;
          std::abs((int)this_00);
          pcVar9 = "";
          if (dVar1 <= extraout_XMM0_Qa) {
            pcVar9 = "OK";
          }
          printf("   Row %4d; Count = %2d; Merit = %11.4g; Value = %11.4g: %s\n",
                 (double)(int)(local_c - 1) * 1.0 * (double)(int)(uVar4 - 1),vVar2,(ulong)uVar3,
                 (ulong)uVar4,pcVar9);
        }
        puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3f0),
                                    (long)(int)local_10);
        local_10 = *puVar7;
      }
    }
  }
  return;
}

Assistant:

void HFactor::reportAsm() {
  for (HighsInt count = 1; count <= num_row; count++) {
    if (col_link_first[count] < 0) continue;
    for (HighsInt j = col_link_first[count]; j != -1; j = col_link_next[j]) {
      double min_pivot = mc_min_pivot[j];
      HighsInt start = mc_start[j];
      HighsInt end = start + mc_count_a[j];
      printf("Col %4d: count = %2d; min_pivot = %10.4g; [%4d, %4d)\n", (int)j,
             (int)count, min_pivot, (int)start, (int)end);
      for (HighsInt k = start; k < end; k++) {
        HighsInt i = mc_index[k];
        double value = mc_value[k];
        //	if (abs_value < 1e-8) continue;
        HighsInt row_count = mr_count[i];
        double merit_local = 1.0 * (count - 1) * (row_count - 1);
        printf("   Row %4d; Count = %2d; Merit = %11.4g; Value = %11.4g: %s\n",
               (int)i, (int)row_count, merit_local, value,
               std::abs(value) >= min_pivot ? "OK" : "");
      }
    }
  }
}